

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::pair<unsigned_int,_unsigned_int>_>
::load(list_caster<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::pair<unsigned_int,_unsigned_int>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  byte bVar2;
  PyObject *in_RDI;
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence s;
  value_type *in_stack_fffffffffffffee8;
  handle in_stack_fffffffffffffef0;
  template_cast_op_type<typename_std::add_rvalue_reference<pair<unsigned_int,_unsigned_int>_&&>::type>
  in_stack_fffffffffffffef8;
  undefined5 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  uint in_stack_ffffffffffffff3c;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  handle in_stack_ffffffffffffff48;
  byte local_1;
  
  bVar1 = isinstance<pybind11::sequence,_0>(in_stack_fffffffffffffef0);
  if ((!bVar1) || (bVar1 = isinstance<pybind11::str,_0>(in_stack_fffffffffffffef0), bVar1)) {
    local_1 = 0;
  }
  else {
    reinterpret_borrow<pybind11::sequence>((handle)in_stack_fffffffffffffef8);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::clear((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)0x2ed406);
    sequence::sequence((sequence *)in_stack_fffffffffffffef0.m_ptr,
                       (sequence *)in_stack_fffffffffffffee8);
    reserve_maybe<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_0>
              ((list_caster<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::pair<unsigned_int,_unsigned_int>_>
                *)CONCAT17(in_stack_ffffffffffffff07,
                           CONCAT16(in_stack_ffffffffffffff06,
                                    CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))),
               (sequence *)in_stack_fffffffffffffef8,
               (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)in_stack_fffffffffffffef0.m_ptr);
    sequence::~sequence((sequence *)0x2ed43e);
    sequence::begin((sequence *)in_stack_fffffffffffffef0.m_ptr);
    sequence::end((sequence *)in_stack_fffffffffffffef0.m_ptr);
    while (bVar1 = detail::operator!=((It *)in_stack_fffffffffffffef0.m_ptr,
                                      (It *)in_stack_fffffffffffffee8), bVar1) {
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 in_stack_fffffffffffffee8);
      type_caster<std::pair<unsigned_int,_unsigned_int>,_void>::type_caster
                ((type_caster<std::pair<unsigned_int,_unsigned_int>,_void> *)0x2ed4fa);
      accessor::operator_cast_to_object
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 in_stack_fffffffffffffef8);
      bVar1 = tuple_caster<std::pair,_unsigned_int,_unsigned_int>::load
                        ((tuple_caster<std::pair,_unsigned_int,_unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff48,SUB41(in_stack_ffffffffffffff3c >> 0x18,0));
      bVar2 = bVar1 ^ 0xff;
      object::~object((object *)0x2ed54b);
      bVar1 = (bVar2 & 1) != 0;
      if (bVar1) {
        local_1 = 0;
      }
      else {
        in_stack_fffffffffffffef0.m_ptr = in_RDI;
        in_stack_fffffffffffffef8 =
             cast_op<std::pair<unsigned_int,unsigned_int>&&>
                       ((make_caster<std::pair<unsigned_int,_unsigned_int>_&&> *)
                        in_stack_fffffffffffffee8);
        in_stack_ffffffffffffff3c = in_stack_fffffffffffffef8.first;
        in_stack_ffffffffffffff40 = in_stack_fffffffffffffef8.second;
        std::
        vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)in_stack_fffffffffffffef0.m_ptr,in_stack_fffffffffffffee8);
      }
      in_stack_ffffffffffffff44 = (uint)bVar1;
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)0x2ed62d);
      if (in_stack_ffffffffffffff44 != 0) goto LAB_002ed669;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 in_stack_fffffffffffffef0.m_ptr);
    }
    local_1 = 1;
LAB_002ed669:
    sequence::~sequence((sequence *)0x2ed676);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }